

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

nhdp_naddr * nhdp_db_neighbor_addr_add(nhdp_neighbor *neigh,netaddr *addr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint8_t uVar4;
  nhdp_naddr *ptr;
  
  ptr = (nhdp_naddr *)oonf_class_malloc(&_naddr_info);
  if (ptr != (nhdp_naddr *)0x0) {
    uVar4 = addr->_prefix_len;
    (ptr->neigh_addr)._type = addr->_type;
    (ptr->neigh_addr)._prefix_len = uVar4;
    uVar1 = *(undefined4 *)(addr->_addr + 4);
    uVar2 = *(undefined4 *)(addr->_addr + 8);
    uVar3 = *(undefined4 *)(addr->_addr + 0xc);
    *(undefined4 *)(ptr->neigh_addr)._addr = *(undefined4 *)addr->_addr;
    *(undefined4 *)((ptr->neigh_addr)._addr + 4) = uVar1;
    *(undefined4 *)((ptr->neigh_addr)._addr + 8) = uVar2;
    *(undefined4 *)((ptr->neigh_addr)._addr + 0xc) = uVar3;
    (ptr->_neigh_node).key = ptr;
    (ptr->_global_node).key = ptr;
    ptr->neigh = neigh;
    (ptr->_lost_vtime).class = &_naddr_vtime_info;
    avl_insert(&_naddr_tree,&ptr->_global_node);
    avl_insert(&neigh->_neigh_addresses,&ptr->_neigh_node);
    oonf_class_event(&_naddr_info,ptr,OONF_OBJECT_ADDED);
  }
  return ptr;
}

Assistant:

struct nhdp_naddr *
nhdp_db_neighbor_addr_add(struct nhdp_neighbor *neigh, const struct netaddr *addr) {
  struct nhdp_naddr *naddr;

  naddr = oonf_class_malloc(&_naddr_info);
  if (naddr == NULL) {
    return NULL;
  }

  /* initialize key */
  memcpy(&naddr->neigh_addr, addr, sizeof(naddr->neigh_addr));
  naddr->_neigh_node.key = &naddr->neigh_addr;
  naddr->_global_node.key = &naddr->neigh_addr;

  /* initialize backward link */
  naddr->neigh = neigh;

  /* initialize timer for lost addresses */
  naddr->_lost_vtime.class = &_naddr_vtime_info;

  /* add to trees */
  avl_insert(&_naddr_tree, &naddr->_global_node);
  avl_insert(&neigh->_neigh_addresses, &naddr->_neigh_node);

  /* trigger event */
  oonf_class_event(&_naddr_info, naddr, OONF_OBJECT_ADDED);

  return naddr;
}